

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numericconstant.cpp
# Opt level: O2

void __thiscall NumericConstant::NumericConstant(NumericConstant *this,int64_t value)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,value);
  NumericConstant(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

NumericConstant::NumericConstant(std::int64_t value)
	: NumericConstant(std::to_string(value)) {

}